

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O2

bool __thiscall GNUmakeTokenPoolPosix::AcquireToken(GNUmakeTokenPoolPosix *this)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  int signum;
  char buf;
  timeval timeout;
  itimerval local_1d8;
  fd_set set;
  sigaction old_act;
  sigaction local_a0;
  
  timeout.tv_sec = 0;
  timeout.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    set.fds_bits[lVar2] = 0;
  }
  iVar1 = this->rfd_;
  set.fds_bits[iVar1 / 0x40] = set.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  iVar1 = select(iVar1 + 1,(fd_set *)&set,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
  if ((0 < iVar1) && (dup_rfd_ = dup(this->rfd_), dup_rfd_ != -1)) {
    memset(&local_a0.sa_mask,0,0x90);
    local_a0.__sigaction_handler.sa_handler = CloseDupRfd;
    signum = 0x11;
    iVar1 = sigaction(0x11,&local_a0,(sigaction *)&old_act);
    if (iVar1 == 0) {
      local_1d8.it_interval.tv_sec = 0;
      local_1d8.it_interval.tv_usec = 0;
      local_1d8.it_value.tv_sec = 0;
      local_1d8.it_value.tv_usec = 100000;
      iVar1 = setitimer(ITIMER_REAL,&local_1d8,(itimerval *)0x0);
      if (iVar1 == 0) {
        sVar3 = read(dup_rfd_,&buf,1);
        local_1d8.it_interval.tv_sec = 0;
        local_1d8.it_interval.tv_usec = 0;
        local_1d8.it_value.tv_sec = 0;
        local_1d8.it_value.tv_usec = 0;
        setitimer(ITIMER_REAL,&local_1d8,(itimerval *)0x0);
        iVar1 = 0x11;
        sigaction(0x11,(sigaction *)&old_act,(sigaction *)0x0);
        CloseDupRfd(iVar1);
        if ((int)sVar3 < 1) {
          return false;
        }
        return true;
      }
      signum = 0x11;
      sigaction(0x11,(sigaction *)&old_act,(sigaction *)0x0);
    }
    CloseDupRfd(signum);
  }
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::AcquireToken() {
  // Please read
  //
  //   http://make.mad-scientist.net/papers/jobserver-implementation/
  //
  // for the reasoning behind the following code.
  //
  // Try to read one character from the pipe. Returns true on success.
  //
  // First check if read() would succeed without blocking.
#ifdef USE_PPOLL
  pollfd pollfds[] = {{rfd_, POLLIN, 0}};
  int ret = poll(pollfds, 1, 0);
#else
  fd_set set;
  struct timeval timeout = { 0, 0 };
  FD_ZERO(&set);
  FD_SET(rfd_, &set);
  int ret = select(rfd_ + 1, &set, NULL, NULL, &timeout);
#endif
  if (ret > 0) {
    // Handle potential race condition:
    //  - the above check succeeded, i.e. read() should not block
    //  - the character disappears before we call read()
    //
    // Create a duplicate of rfd_. The duplicate file descriptor dup_rfd_
    // can safely be closed by signal handlers without affecting rfd_.
    dup_rfd_ = dup(rfd_);

    if (dup_rfd_ != -1) {
      struct sigaction act, old_act;
      int ret = 0;

      // Temporarily replace SIGCHLD handler with our own
      memset(&act, 0, sizeof(act));
      act.sa_handler = CloseDupRfd;
      if (sigaction(SIGCHLD, &act, &old_act) == 0) {
        struct itimerval timeout;

        // install a 100ms timeout that generates SIGALARM on expiration
        memset(&timeout, 0, sizeof(timeout));
        timeout.it_value.tv_usec = 100 * 1000; // [ms] -> [usec]
        if (setitimer(ITIMER_REAL, &timeout, NULL) == 0) {
          char buf;

          // Now try to read() from dup_rfd_. Return values from read():
          //
          // 1. token read                               ->  1
          // 2. pipe closed                              ->  0
          // 3. alarm expires                            -> -1 (EINTR)
          // 4. child exits                              -> -1 (EINTR)
          // 5. alarm expired before entering read()     -> -1 (EBADF)
          // 6. child exited before entering read()      -> -1 (EBADF)
          // 7. child exited before handler is installed -> go to 1 - 3
          ret = read(dup_rfd_, &buf, 1);

          // disarm timer
          memset(&timeout, 0, sizeof(timeout));
          setitimer(ITIMER_REAL, &timeout, NULL);
        }

        sigaction(SIGCHLD, &old_act, NULL);
      }

      CloseDupRfd(0);

      // Case 1 from above list
      if (ret > 0)
        return true;
    }
  }

  // read() would block, i.e. no token available,
  // cases 2-6 from above list or
  // select() / poll() / dup() / sigaction() / setitimer() failed
  return false;
}